

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall
HighsHashTable<int,_unsigned_int>::HighsHashTable(HighsHashTable<int,_unsigned_int> *this)

{
  unique_ptr<HighsHashTableEntry<int,_unsigned_int>,_HighsHashTable<int,_unsigned_int>::OpNewDeleter>
  *in_RDI;
  HighsHashTable<int,_unsigned_int> *unaff_retaddr;
  unique_ptr<HighsHashTableEntry<int,_unsigned_int>,_HighsHashTable<int,_unsigned_int>::OpNewDeleter>
  *capacity;
  
  capacity = in_RDI;
  std::
  unique_ptr<HighsHashTableEntry<int,unsigned_int>,HighsHashTable<int,unsigned_int>::OpNewDeleter>::
  unique_ptr<HighsHashTable<int,unsigned_int>::OpNewDeleter,void>(in_RDI);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI);
  in_RDI[4]._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_unsigned_int>,_HighsHashTable<int,_unsigned_int>::OpNewDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_unsigned_int>_*,_HighsHashTable<int,_unsigned_int>::OpNewDeleter>
  .super__Head_base<0UL,_HighsHashTableEntry<int,_unsigned_int>_*,_false>._M_head_impl =
       (HighsHashTableEntry<int,_unsigned_int> *)0x0;
  makeEmptyTable(unaff_retaddr,(u64)capacity);
  return;
}

Assistant:

HighsHashTable() { makeEmptyTable(128); }